

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O0

int64_t __thiscall TPZGraphElT::EqNum(TPZGraphElT *this,TPZVec<int> *co)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int *piVar7;
  TPZVec<int> *in_RSI;
  long in_RDI;
  int run;
  int64_t neq;
  int64_t first;
  int is;
  int imax;
  int res;
  int loc;
  int orient [3];
  int local_4c;
  int64_t local_48;
  int local_34;
  int local_28;
  uint auStack_24 [3];
  TPZVec<int> *local_18;
  int64_t local_8;
  
  local_18 = in_RSI;
  iVar4 = TPZGraphMesh::Res(*(TPZGraphMesh **)(in_RDI + 0x10));
  iVar4 = 1 << ((byte)iVar4 & 0x1f);
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    iVar5 = TPZGraphNode::SequenceNumber(*(TPZGraphNode **)(in_RDI + 0x20 + (long)local_34 * 8));
    iVar6 = TPZGraphNode::SequenceNumber
                      (*(TPZGraphNode **)(in_RDI + 0x20 + (long)((local_34 + 1) % 3) * 8));
    auStack_24[local_34] = (uint)(iVar6 < iVar5);
  }
  piVar7 = TPZVec<int>::operator[](local_18,0);
  if ((*piVar7 == 0) && (piVar7 = TPZVec<int>::operator[](local_18,1), *piVar7 == 0)) {
    local_8 = TPZGraphNode::FirstPoint(*(TPZGraphNode **)(in_RDI + 0x20));
  }
  else {
    piVar7 = TPZVec<int>::operator[](local_18,0);
    if ((*piVar7 == iVar4) && (piVar7 = TPZVec<int>::operator[](local_18,1), *piVar7 == 0)) {
      local_8 = TPZGraphNode::FirstPoint(*(TPZGraphNode **)(in_RDI + 0x28));
    }
    else {
      piVar7 = TPZVec<int>::operator[](local_18,0);
      if ((*piVar7 == 0) && (piVar7 = TPZVec<int>::operator[](local_18,1), *piVar7 == iVar4)) {
        local_8 = TPZGraphNode::FirstPoint(*(TPZGraphNode **)(in_RDI + 0x30));
      }
      else {
        piVar7 = TPZVec<int>::operator[](local_18,1);
        if (*piVar7 == 0) {
          local_28 = 0;
        }
        else {
          piVar7 = TPZVec<int>::operator[](local_18,0);
          iVar1 = *piVar7;
          piVar7 = TPZVec<int>::operator[](local_18,1);
          if (iVar1 + *piVar7 == iVar4) {
            local_28 = 1;
          }
          else {
            piVar7 = TPZVec<int>::operator[](local_18,0);
            if (*piVar7 == 0) {
              local_28 = 2;
            }
            else {
              local_28 = 3;
            }
          }
        }
        iVar5 = TPZGraphNode::FirstPoint(*(TPZGraphNode **)(in_RDI + 0x38 + (long)local_28 * 8));
        switch(local_28) {
        case 0:
          piVar7 = TPZVec<int>::operator[](local_18,0);
          iVar1 = *piVar7;
          uVar2 = auStack_24[local_28];
          piVar7 = TPZVec<int>::operator[](local_18,0);
          iVar3 = *piVar7;
          piVar7 = TPZVec<int>::operator[](local_18,0);
          local_48 = iVar5 + (iVar1 + -1) + (long)(int)(uVar2 * ((iVar4 - iVar3) - *piVar7));
          break;
        case 1:
          piVar7 = TPZVec<int>::operator[](local_18,0);
          iVar1 = *piVar7;
          uVar2 = auStack_24[local_28];
          piVar7 = TPZVec<int>::operator[](local_18,0);
          iVar3 = *piVar7;
          piVar7 = TPZVec<int>::operator[](local_18,0);
          local_48 = iVar5 + ((iVar4 + -1) - iVar1) +
                     (long)(int)(uVar2 * ((iVar3 - iVar4) + *piVar7));
          break;
        case 2:
          piVar7 = TPZVec<int>::operator[](local_18,1);
          iVar1 = *piVar7;
          uVar2 = auStack_24[local_28];
          piVar7 = TPZVec<int>::operator[](local_18,1);
          iVar3 = *piVar7;
          piVar7 = TPZVec<int>::operator[](local_18,1);
          local_48 = iVar5 + ((iVar4 + -1) - iVar1) +
                     (long)(int)(uVar2 * ((iVar3 - iVar4) + *piVar7));
          break;
        case 3:
          piVar7 = TPZVec<int>::operator[](local_18,1);
          local_48 = iVar5 + (*piVar7 + -1);
          for (local_4c = 1; piVar7 = TPZVec<int>::operator[](local_18,0), local_4c < *piVar7;
              local_4c = local_4c + 1) {
            local_48 = ((iVar4 - local_4c) + -1) + local_48;
          }
          break;
        default:
          local_48 = 0;
        }
        local_8 = local_48;
      }
    }
  }
  return local_8;
}

Assistant:

int64_t TPZGraphElT::EqNum(TPZVec<int> &co){
	int orient[3];
	int loc;
	int res = fGraphMesh->Res();
	int imax = (1<<res);
	for(int is=0;is<3;is++) {
		orient[is] = (fConnects[is]->SequenceNumber() > fConnects[(is+1)%3]->SequenceNumber()) ? 1 : 0;
	}
	if(co[0]==0 && co[1]==0) return fConnects[0]->FirstPoint();
	if(co[0]==imax && co[1]==0) return fConnects[1]->FirstPoint();
	if(co[0]==0 && co[1]==imax) return fConnects[2]->FirstPoint();
	
	if(co[1]==0) loc = 0;
	else if(co[0]+co[1]==imax) loc=1;
	else if(co[0]==0) loc=2;
	else loc=3;
	int64_t first = fConnects[3+loc]->FirstPoint();
	int64_t neq;
	switch(loc) {
		case 0:
			neq = first + (co[0]-1) + orient[loc]*(imax-1-co[0]-co[0]+1);
			break;
		case 1:
			neq = first + (imax-1-co[0]) + orient[loc]*(co[0]-1-imax+1+co[0]);
			break;
		case 2:
			neq = first + (imax-1-co[1]) + orient[loc]*(co[1]-1-imax+1+co[1]);
			break;
		case 3:
		{
			neq = first + (co[1]-1);
			for(int run=1;run<co[0];run++) neq += imax-run-1;
			break;
		}
		default:
			neq = 0;
			break;
	}
	return neq;
}